

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O2

void nghttp2_pq_update(nghttp2_pq *pq,nghttp2_pq_item_cb fun,void *arg)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  size_t index;
  
  index = pq->length;
  if (index != 0) {
    uVar2 = 0;
    for (uVar3 = 0; uVar3 < index; uVar3 = uVar3 + 1) {
      uVar1 = (*fun)(pq->q[uVar3],arg);
      uVar2 = uVar2 | uVar1;
      index = pq->length;
    }
    if (uVar2 != 0) {
      while (index = index - 1, index != 0xffffffffffffffff) {
        bubble_down(pq,index);
      }
    }
  }
  return;
}

Assistant:

void nghttp2_pq_update(nghttp2_pq *pq, nghttp2_pq_item_cb fun, void *arg) {
  size_t i;
  int rv = 0;
  if (pq->length == 0) {
    return;
  }
  for (i = 0; i < pq->length; ++i) {
    rv |= (*fun)(pq->q[i], arg);
  }
  if (rv) {
    for (i = pq->length; i > 0; --i) {
      bubble_down(pq, i - 1);
    }
  }
}